

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

void CVmPack::skip_group(CVmPackPos *p,wchar_t close_paren)

{
  wchar_t wVar1;
  int iVar2;
  
  CVmPackPos::inc(p);
  CVmPackPos::getch(p);
  if (p->len != 0) {
    iVar2 = 1;
    do {
      wVar1 = CVmPackPos::getch(p);
      if (wVar1 < L']') {
        if (wVar1 != L'(') {
          if (wVar1 == L')') goto LAB_002afe33;
          if (wVar1 != L'[') goto LAB_002afe36;
        }
LAB_002afe2e:
        iVar2 = iVar2 + 1;
      }
      else if ((wVar1 == L']') || (wVar1 == L'}')) {
LAB_002afe33:
        iVar2 = iVar2 + -1;
      }
      else if (wVar1 == L'{') goto LAB_002afe2e;
LAB_002afe36:
      if (wVar1 == close_paren && iVar2 == 0) break;
      CVmPackPos::inc(p);
      CVmPackPos::getch(p);
    } while (p->len != 0);
  }
  CVmPackPos::getch(p);
  if (p->len == 0) {
    err_throw_a(0x6b,1,0,(ulong)(uint)p->idx);
  }
  return;
}

Assistant:

void CVmPack::skip_group(CVmPackPos *p, wchar_t close_paren)
{
    /* scan ahead to the matching close paren */
    int depth = 1;
    for (p->inc() ; p->more() ; p->inc())
    {
        /* note any further nesting */
        wchar_t c = p->getch();
        switch (c)
        {
        case '(':
        case '[':
        case '{':
            depth++;
            break;

        case ')':
        case ']':
        case '}':
            depth--;
            break;
        }

        /* 
         *   if this is our close paren, and we're not in nested parens or
         *   other brackets, we're done 
         */
        if (c == close_paren && depth == 0)
            break;
    }

    /* make sure we found the matching close paren */
    if (!p->more())
        err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());
}